

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t pick_interinter_seg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                           int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  uint8_t uVar1;
  uint8_t uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  uint8_t *in_RCX;
  byte in_DL;
  long in_RSI;
  uint8_t *in_R8;
  int16_t *in_R9;
  int16_t *in_stack_00000008;
  ulong *in_stack_00000010;
  int64_t rd0;
  uint64_t sse;
  uint8_t *tmp_mask [2];
  uint8_t seg_mask [32768];
  int bd_round;
  int hbd;
  DIFFWTD_MASK_TYPE best_mask_type;
  int64_t best_rd;
  DIFFWTD_MASK_TYPE cur_mask_type;
  int64_t dist;
  int rate;
  int N;
  int bh;
  int bw;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  byte local_80ac;
  undefined1 *local_8098 [2];
  undefined1 local_8088 [44];
  int in_stack_ffffffffffff7fa4;
  int64_t in_stack_ffffffffffff7fa8;
  int in_stack_ffffffffffff7fb0;
  BLOCK_SIZE in_stack_ffffffffffff7fb7;
  MACROBLOCK *in_stack_ffffffffffff7fb8;
  AV1_COMP *in_stack_ffffffffffff7fc0;
  int *in_stack_ffffffffffff7fd0;
  int64_t *in_stack_ffffffffffff7fd8;
  byte local_71;
  long local_70;
  byte local_61;
  long local_60;
  int local_58;
  
  lVar3 = **(long **)(in_RSI + 0x2058);
  uVar1 = block_size_wide[in_DL];
  uVar2 = block_size_high[in_DL];
  iVar5 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_DL] & 0x1f);
  local_70 = 0x7fffffffffffffff;
  local_71 = 0;
  iVar6 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  if (iVar6 == 0) {
    local_80ac = 0;
  }
  else {
    local_80ac = ((char)*(undefined4 *)(in_RSI + 0x2b40) + -8) * '\x02';
  }
  local_8098[0] = *(undefined1 **)(in_RSI + 0x2bb0);
  local_8098[1] = local_8088;
  for (local_61 = 0; local_61 < 2; local_61 = local_61 + 1) {
    iVar4 = (int)uVar1;
    if (iVar6 == 0) {
      (*av1_build_compound_diffwtd_mask)
                (local_8098[local_61],local_61,in_RCX,iVar4,in_R8,iVar4,(int)uVar2,iVar4);
    }
    else {
      (*av1_build_compound_diffwtd_mask_highbd)
                (local_8098[local_61],local_61,(uint8_t *)((ulong)in_RCX >> 1),iVar4,
                 (uint8_t *)((ulong)in_R8 >> 1),iVar4,(int)uVar2,iVar4,*(int *)(in_RSI + 0x2b40));
    }
    uVar7 = (*av1_wedge_sse_from_residuals)(in_R9,in_stack_00000008,local_8098[local_61],iVar5);
    model_rd_with_curvfit
              (in_stack_ffffffffffff7fc0,in_stack_ffffffffffff7fb8,in_stack_ffffffffffff7fb7,
               in_stack_ffffffffffff7fb0,in_stack_ffffffffffff7fa8,in_stack_ffffffffffff7fa4,
               in_stack_ffffffffffff7fd0,in_stack_ffffffffffff7fd8);
    lVar8 = ((long)local_58 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + local_60 * 0x80;
    if (lVar8 < local_70) {
      local_71 = local_61;
      *in_stack_00000010 = uVar7 + (long)((1 << (local_80ac & 0x1f)) >> 1) >> (local_80ac & 0x3f);
      local_70 = lVar8;
    }
  }
  *(byte *)(lVar3 + 0x52) = local_71;
  if (local_71 == 1) {
    memcpy(*(void **)(in_RSI + 0x2bb0),local_8088,(long)(iVar5 << 1));
  }
  return local_70;
}

Assistant:

static int64_t pick_interinter_seg(const AV1_COMP *const cpi,
                                   MACROBLOCK *const x, const BLOCK_SIZE bsize,
                                   const uint8_t *const p0,
                                   const uint8_t *const p1,
                                   const int16_t *const residual1,
                                   const int16_t *const diff10,
                                   uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = 1 << num_pels_log2_lookup[bsize];
  int rate;
  int64_t dist;
  DIFFWTD_MASK_TYPE cur_mask_type;
  int64_t best_rd = INT64_MAX;
  DIFFWTD_MASK_TYPE best_mask_type = 0;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  DECLARE_ALIGNED(16, uint8_t, seg_mask[2 * MAX_SB_SQUARE]);
  uint8_t *tmp_mask[2] = { xd->seg_mask, seg_mask };
  // try each mask type and its inverse
  for (cur_mask_type = 0; cur_mask_type < DIFFWTD_MASK_TYPES; cur_mask_type++) {
    // build mask and inverse
#if CONFIG_AV1_HIGHBITDEPTH
    if (hbd)
      av1_build_compound_diffwtd_mask_highbd(
          tmp_mask[cur_mask_type], cur_mask_type, CONVERT_TO_BYTEPTR(p0), bw,
          CONVERT_TO_BYTEPTR(p1), bw, bh, bw, xd->bd);
    else
      av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type,
                                      p0, bw, p1, bw, bh, bw);
#else
    (void)hbd;
    av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type, p0,
                                    bw, p1, bw, bh, bw);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    // compute rd for mask
    uint64_t sse = av1_wedge_sse_from_residuals(residual1, diff10,
                                                tmp_mask[cur_mask_type], N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    const int64_t rd0 = RDCOST(x->rdmult, rate, dist);

    if (rd0 < best_rd) {
      best_mask_type = cur_mask_type;
      best_rd = rd0;
      *best_sse = sse;
    }
  }
  mbmi->interinter_comp.mask_type = best_mask_type;
  if (best_mask_type == DIFFWTD_38_INV) {
    memcpy(xd->seg_mask, seg_mask, N * 2);
  }
  return best_rd;
}